

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::Load(Cluster *this,longlong *pos,long *len)

{
  IMkvReader *pReader;
  int iVar1;
  longlong lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  longlong avail;
  longlong total;
  uint local_7c;
  long local_78;
  ulong local_70;
  longlong local_68;
  longlong local_60;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  if (this->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  if (-1 < this->m_timecode) {
    return 0;
  }
  if (this->m_pos != this->m_element_start) {
    return -1;
  }
  if (-1 < this->m_element_size) {
    return -1;
  }
  pReader = this->m_pSegment->m_pReader;
  iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_38,&local_78);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  if (-1 < local_38) {
    if (local_38 < local_78) {
      return -2;
    }
    if (local_38 < this->m_pos) {
      return -2;
    }
  }
  lVar2 = this->m_pos;
  *pos = lVar2;
  if (lVar2 < local_78) {
    lVar2 = GetUIntLength(pReader,lVar2,len);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (lVar2 != 0) {
      return -3;
    }
    if (local_78 < *len + *pos) {
      return -3;
    }
    lVar2 = ReadID(pReader,*pos,len);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (lVar2 != 0x1f43b675) {
      return -2;
    }
    lVar4 = *pos + *len;
    *pos = lVar4;
    if (lVar4 < local_78) {
      lVar2 = GetUIntLength(pReader,lVar4,len);
      if (lVar2 < 0) {
        return lVar2;
      }
      if (lVar2 != 0) {
        return -3;
      }
      if (local_78 < *len + *pos) {
        return -3;
      }
      uVar3 = ReadUInt(pReader,*pos,len);
      if ((long)uVar3 < 0) {
        return -1;
      }
      if (uVar3 == 0) {
        return -2;
      }
      lVar4 = *len;
      lVar5 = *pos + lVar4;
      *pos = lVar5;
      local_40 = -1L << ((char)lVar4 * '\a' & 0x3fU) ^ uVar3;
      lVar4 = uVar3 + lVar5;
      if (local_40 == 0xffffffffffffffff) {
        lVar4 = -1;
      }
      if (-1 < lVar4 && lVar4 <= lVar5) {
        return -2;
      }
      local_58 = -1;
      local_50 = 2;
      local_48 = 1;
      local_60 = -1;
      if (lVar5 < local_78) {
        lVar2 = GetUIntLength(pReader,lVar5,len);
        local_7c = 1;
        if ((((-1 < lVar2) && (lVar2 == 0)) && ((lVar4 < 0 || (*len + *pos <= lVar4)))) &&
           (*len + *pos <= local_78)) {
          local_68 = ReadID(pReader,*pos,len);
          if ((-1 < local_68) && (local_68 != 0)) {
            if (local_68 == 0x1c53bb6b) {
              lVar4 = (*(code *)(&DAT_0011d868 + *(int *)(&DAT_0011d868 + local_50 * 4)))();
              return lVar4;
            }
            if (local_68 == 0x1f43b675) {
              lVar4 = (*(code *)(&DAT_0011d868 + *(int *)(&DAT_0011d868 + local_50 * 4)))();
              return lVar4;
            }
            lVar5 = *pos + *len;
            *pos = lVar5;
            if (local_78 <= lVar5) {
              *len = 1;
              lVar4 = (*(code *)(&DAT_0011d868 + *(int *)(&DAT_0011d868 + local_48 * 4)))();
              return lVar4;
            }
            lVar2 = GetUIntLength(pReader,lVar5,len);
            if ((((-1 < lVar2) && (lVar2 == 0)) && ((lVar4 < 0 || (*len + *pos <= lVar4)))) &&
               (((*len + *pos <= local_78 &&
                 (local_70 = ReadUInt(pReader,*pos,len), -1 < (long)local_70)) &&
                ((-1L << ((char)*len * '\a' & 0x3fU) ^ local_70) != 0xffffffffffffffff)))) {
              lVar5 = *len + *pos;
              *pos = lVar5;
              if (lVar4 < 0 || lVar5 <= lVar4) {
                if (local_70 == 0) {
                  local_7c = 3;
                }
                else if ((lVar4 < 0) || ((long)(local_70 + lVar5) <= lVar4)) {
                  if ((local_68 == 0xa0) || (local_68 == 0xa3)) {
                    local_7c = 2;
                  }
                  else {
                    if (local_68 == 0xe7) {
                      *len = local_70;
                      if ((local_78 < (long)(local_70 + lVar5)) ||
                         (local_60 = UnserializeUInt(pReader,lVar5,local_70), local_60 < 0))
                      goto LAB_0011a9b2;
                      local_58 = *pos + local_70;
                    }
                    lVar5 = *pos;
                    *pos = local_70 + lVar5;
                    local_7c = (uint)(lVar4 < (long)(local_70 + lVar5) && -1 < lVar4);
                  }
                }
              }
            }
          }
        }
LAB_0011a9b2:
        lVar4 = (*(code *)(&DAT_0011d868 + *(int *)(&DAT_0011d868 + (ulong)local_7c * 4)))();
        return lVar4;
      }
    }
  }
  *len = 1;
  return -3;
}

Assistant:

long Cluster::Load(long long& pos, long& len) const {
  if (m_pSegment == NULL)
    return E_PARSE_FAILED;

  if (m_timecode >= 0)  // at least partially loaded
    return 0;

  if (m_pos != m_element_start || m_element_size >= 0)
    return E_PARSE_FAILED;

  IMkvReader* const pReader = m_pSegment->m_pReader;
  long long total, avail;
  const int status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && (avail > total || m_pos > total))
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  long long cluster_size = -1;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error or underflow
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long id_ = ReadID(pReader, pos, len);

  if (id_ < 0)  // error
    return static_cast<long>(id_);

  if (id_ != libwebm::kMkvCluster)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  // read cluster size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(cluster_size);

  if (size == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size of element

  const long long unknown_size = (1LL << (7 * len)) - 1;

  if (size != unknown_size)
    cluster_size = size;

  // pos points to start of payload
  long long timecode = -1;
  long long new_pos = -1;
  bool bBlock = false;

  long long cluster_stop = (cluster_size < 0) ? -1 : pos + cluster_size;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      break;

    if (id == libwebm::kMkvCues)
      break;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvTimecode) {
      len = static_cast<long>(size);

      if ((pos + size) > avail)
        return E_BUFFER_NOT_FULL;

      timecode = UnserializeUInt(pReader, pos, size);

      if (timecode < 0)  // error (or underflow)
        return static_cast<long>(timecode);

      new_pos = pos + size;

      if (bBlock)
        break;
    } else if (id == libwebm::kMkvBlockGroup) {
      bBlock = true;
      break;
    } else if (id == libwebm::kMkvSimpleBlock) {
      bBlock = true;
      break;
    }

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (cluster_stop >= 0 && pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (timecode < 0)  // no timecode found
    return E_FILE_FORMAT_INVALID;

  if (!bBlock)
    return E_FILE_FORMAT_INVALID;

  m_pos = new_pos;  // designates position just beyond timecode payload
  m_timecode = timecode;  // m_timecode >= 0 means we're partially loaded

  if (cluster_size >= 0)
    m_element_size = cluster_stop - m_element_start;

  return 0;
}